

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

void __thiscall
TiXmlDeclaration::TiXmlDeclaration
          (TiXmlDeclaration *this,char *_version,char *_encoding,char *_standalone)

{
  size_t sVar1;
  
  (this->super_TiXmlNode).super_TiXmlBase.location.row = -1;
  (this->super_TiXmlNode).super_TiXmlBase.location.col = -1;
  (this->super_TiXmlNode).super_TiXmlBase.userData = (void *)0x0;
  (this->super_TiXmlNode).parent = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).value.rep_ = &TiXmlString::nullrep_;
  (this->super_TiXmlNode).type = TINYXML_DECLARATION;
  (this->super_TiXmlNode).firstChild = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).lastChild = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).prev = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).next = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase =
       (_func_int **)&PTR__TiXmlDeclaration_002188c0;
  (this->version).rep_ = &TiXmlString::nullrep_;
  (this->encoding).rep_ = &TiXmlString::nullrep_;
  (this->standalone).rep_ = &TiXmlString::nullrep_;
  sVar1 = strlen(_version);
  TiXmlString::assign(&this->version,_version,sVar1);
  sVar1 = strlen(_encoding);
  TiXmlString::assign(&this->encoding,_encoding,sVar1);
  sVar1 = strlen(_standalone);
  TiXmlString::assign(&this->standalone,_standalone,sVar1);
  return;
}

Assistant:

TiXmlDeclaration::TiXmlDeclaration( const char * _version,
									const char * _encoding,
									const char * _standalone )
	: TiXmlNode( TiXmlNode::TINYXML_DECLARATION )
{
	version = _version;
	encoding = _encoding;
	standalone = _standalone;
}